

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O1

void __thiscall
chrono::ChLoaderGravity::ChLoaderGravity
          (ChLoaderGravity *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  shared_ptr<chrono::ChLoadableUVW> local_18;
  
  local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChLoaderUVWdistributed::ChLoaderUVWdistributed(&this->super_ChLoaderUVWdistributed,&local_18);
  if (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoaderUVWdistributed).super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00138fe0;
  (this->G_acc).m_data[0] = 0.0;
  (this->G_acc).m_data[1] = -9.8;
  (this->G_acc).m_data[2] = 0.0;
  this->num_int_points = 1;
  return;
}

Assistant:

ChLoaderGravity(std::shared_ptr<ChLoadableUVW> mloadable)
        : ChLoaderUVWdistributed(mloadable), G_acc(0, -9.8, 0), num_int_points(1){}